

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_UnmatchedBraces_Test::TestBody(FormatterTest_UnmatchedBraces_Test *this)

{
  bool bVar1;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  Type in_stack_fffffffffffffdbc;
  AssertionResult *in_stack_fffffffffffffdc0;
  char (*in_stack_fffffffffffffdc8) [2];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  allocator *in_stack_fffffffffffffe10;
  string local_168 [38];
  byte local_142;
  undefined1 local_141 [33];
  AssertionResult local_120 [3];
  string local_f0 [38];
  byte local_ca;
  allocator local_c9;
  string local_c8 [32];
  AssertionResult local_a8 [3];
  int local_74;
  string local_70 [38];
  byte local_4a;
  allocator local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"invalid format string",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[2]>(in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_70);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffdc0,
                 (char (*) [93])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_74 = 2;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_74 != 0) goto LAB_0012e4d0;
  }
  else {
LAB_0012e4d0:
    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12e4ec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe10,
               (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
    testing::Message::~Message((Message *)0x12e54f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e5a7);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (bVar1) {
    in_stack_fffffffffffffe10 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"unmatched \'}\' in format string",in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_ca = 0;
    in_stack_fffffffffffffe0f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe0f) {
      fmt::v5::format<char[2]>(in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_f0);
    }
    if ((local_ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffdc0,
                 (char (*) [93])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_74 = 3;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_c8);
    if (local_74 != 0) goto LAB_0012e91c;
  }
  else {
LAB_0012e91c:
    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12e938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe10,
               (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
    testing::Message::~Message((Message *)0x12e995);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e9ed);
  this_00 = local_120;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffffdc0 = (AssertionResult *)local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_141 + 1),"invalid format string",
               (allocator *)in_stack_fffffffffffffdc0);
    std::allocator<char>::~allocator((allocator<char> *)local_141);
    local_142 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffdbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdbc);
    if (bVar1) {
      fmt::v5::format<char[5]>(&this_00->success_);
      std::__cxx11::string::~string(local_168);
    }
    if ((local_142 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffdc0,
                 (char (*) [96])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_74 = 4;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string((string *)(local_141 + 1));
    if (local_74 == 0) goto LAB_0012ee03;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
  testing::AssertionResult::failure_message((AssertionResult *)0x12ed60);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffe10,
             (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
  testing::Message::~Message((Message *)0x12edbb);
LAB_0012ee03:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ee10);
  return;
}

Assistant:

TEST(FormatterTest, UnmatchedBraces) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("}"), format_error, "unmatched '}' in format string");
  EXPECT_THROW_MSG(format("{0{}"), format_error, "invalid format string");
}